

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O1

char * nowide::basic_convert<char,wchar_t>
                 (char *buffer,size_t buffer_size,wchar_t *source_begin,wchar_t *source_end)

{
  wchar_t value;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (buffer_size == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = buffer;
    uVar4 = buffer_size - 1;
    do {
      if (source_begin == source_end) break;
      value = *source_begin;
      source_begin = source_begin + 1;
      bVar1 = false;
      if ((value & 0x1ff800U) == 0xd800 || 0x10ffff < (uint)value) {
        pcVar3 = (char *)0x0;
        uVar5 = uVar4;
      }
      else {
        uVar2 = 1;
        if ((0x7f < (uint)value) && (uVar2 = 2, 0x7ff < (uint)value)) {
          uVar2 = 4 - (ulong)((uint)value < 0x10000);
        }
        uVar5 = uVar4 - uVar2;
        if (uVar4 < uVar2) {
          pcVar3 = (char *)0x0;
          bVar1 = false;
          uVar5 = uVar4;
        }
        else {
          buffer = utf::utf_traits<char,1>::encode<char*>(value,buffer);
          bVar1 = true;
        }
      }
      uVar4 = uVar5;
    } while (bVar1);
    *buffer = '\0';
  }
  return pcVar3;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace nowide::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }